

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::InternReadFile
          (Discreet3DSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *pppNVar1;
  pointer pMVar2;
  int iVar3;
  undefined4 extraout_var;
  runtime_error *prVar4;
  pointer sMesh;
  StreamReaderLE stream;
  Scene _scene;
  Node _rootNode;
  string local_1e0;
  StreamReader<false,_false> local_1c0;
  Scene local_188;
  Node local_128;
  
  pppNVar1 = &local_128.mChildren.
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_128.mParent = (Node *)pppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"rb","");
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_128.mParent);
  StreamReader<false,_false>::StreamReader
            (&local_1c0,(IOStream *)CONCAT44(extraout_var,iVar3),false);
  if (local_128.mParent != (Node *)pppNVar1) {
    operator_delete(local_128.mParent);
  }
  if (((int)local_1c0.end - (int)local_1c0.current & 0xfffffff0U) != 0) {
    this->stream = &local_1c0;
    local_188.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.mMeshes.super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.mMeshes.super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.mMaterials.
    super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.mMeshes.super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.mMaterials.
    super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.mMaterials.
    super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->mScene = &local_188;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"UNNAMED","");
    D3DS::Node::Node(&local_128,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    this->mLastNodeIndex = -1;
    this->mCurrentNode = &local_128;
    this->mRootNode = &local_128;
    local_128.mHierarchyPos = -1;
    local_128.mHierarchyIndex = -1;
    local_128.mParent = (Node *)0x0;
    this->mMasterScale = 1.0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->mBackgroundImage,0,(char *)(this->mBackgroundImage)._M_string_length,
               0x71872f);
    this->bHasBG = false;
    this->bIsPrj = false;
    ParseMainChunk(this);
    sMesh = (this->mScene->mMeshes).
            super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
            super__Vector_impl_data._M_start;
    pMVar2 = (this->mScene->mMeshes).
             super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      if (sMesh == pMVar2) {
        ReplaceDefaultMaterial(this);
        ConvertScene(this,pScene);
        GenerateNodeGraph(this,pScene);
        ApplyMasterScale(this,pScene);
        this->stream = (StreamReaderLE *)0x0;
        this->mRootNode = (Node *)0x0;
        this->mScene = (Scene *)0x0;
        D3DS::Node::~Node(&local_128);
        if (local_188.mLights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.mLights.
                          super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_188.mCameras.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.mCameras.
                          super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::~vector
                  (&local_188.mMeshes);
        std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::~vector
                  (&local_188.mMaterials);
        StreamReader<false,_false>::~StreamReader(&local_1c0);
        return;
      }
      if (((sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
           super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
           super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
           super__Vector_impl_data._M_start) &&
         ((sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start)) break;
      CheckIndices(this,sMesh);
      MakeUnique(this,sMesh);
      ComputeNormalsWithSmoothingsGroups<Assimp::D3DS::Face>
                (&sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>);
      sMesh = sMesh + 1;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1e0,"3DS file contains faces but no vertices: ",pFile);
    std::runtime_error::runtime_error(prVar4,(string *)&local_1e0);
    *(undefined ***)prVar4 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                 "3DS file is either empty or corrupt: ",pFile);
  std::runtime_error::runtime_error(prVar4,(string *)&local_128);
  *(undefined ***)prVar4 = &PTR__runtime_error_00875f28;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Discreet3DSImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16) {
        throw DeadlyImportError("3DS file is either empty or corrupt: " + pFile);
    }
    this->stream = &stream;

    // Allocate our temporary 3DS representation
    D3DS::Scene _scene;
    mScene = &_scene;

    // Initialize members
    D3DS::Node _rootNode("UNNAMED");
    mLastNodeIndex             = -1;
    mCurrentNode               = &_rootNode;
    mRootNode                  = mCurrentNode;
    mRootNode->mHierarchyPos   = -1;
    mRootNode->mHierarchyIndex = -1;
    mRootNode->mParent         = NULL;
    mMasterScale               = 1.0f;
    mBackgroundImage           = "";
    bHasBG                     = false;
    bIsPrj                     = false;

    // Parse the file
    ParseMainChunk();

    // Process all meshes in the file. First check whether all
    // face indices have valid values. The generate our
    // internal verbose representation. Finally compute normal
    // vectors from the smoothing groups we read from the
    // file.
    for (auto &mesh : mScene->mMeshes) {
        if (mesh.mFaces.size() > 0 && mesh.mPositions.size() == 0)  {
            throw DeadlyImportError("3DS file contains faces but no vertices: " + pFile);
        }
        CheckIndices(mesh);
        MakeUnique  (mesh);
        ComputeNormalsWithSmoothingsGroups<D3DS::Face>(mesh);
    }

    // Replace all occurences of the default material with a
    // valid material. Generate it if no material containing
    // DEFAULT in its name has been found in the file
    ReplaceDefaultMaterial();

    // Convert the scene from our internal representation to an
    // aiScene object. This involves copying all meshes, lights
    // and cameras to the scene
    ConvertScene(pScene);

    // Generate the node graph for the scene. This is a little bit
    // tricky since we'll need to split some meshes into sub-meshes
    GenerateNodeGraph(pScene);

    // Now apply the master scaling factor to the scene
    ApplyMasterScale(pScene);

    // Our internal scene representation and the root
    // node will be automatically deleted, so the whole hierarchy will follow

    AI_DEBUG_INVALIDATE_PTR(mRootNode);
    AI_DEBUG_INVALIDATE_PTR(mScene);
    AI_DEBUG_INVALIDATE_PTR(this->stream);
}